

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_witness_stack_set
              (wally_tx_witness_stack *stack,size_t index,uchar *witness,size_t witness_len)

{
  _Bool _Var1;
  wally_tx_witness_item *pwVar2;
  int iVar3;
  uchar *new_witness;
  
  new_witness = (uchar *)0x0;
  _Var1 = is_valid_witness_stack(stack);
  iVar3 = -2;
  if ((_Var1) && (witness != (uchar *)0x0 || witness_len == 0)) {
    _Var1 = clone_data(&new_witness,witness,witness_len);
    iVar3 = -3;
    if (_Var1) {
      if (stack->num_items <= index) {
        if (stack->items_allocation_len <= index) {
          pwVar2 = (wally_tx_witness_item *)
                   realloc_array(stack->items,stack->items_allocation_len,index + 1,0x10);
          if (pwVar2 == (wally_tx_witness_item *)0x0) {
            clear_and_free(new_witness,witness_len);
            return -3;
          }
          clear_and_free(stack->items,stack->num_items << 4);
          stack->items = pwVar2;
          stack->items_allocation_len = index + 1;
        }
        stack->num_items = index + 1;
      }
      clear_and_free(stack->items[index].witness,stack->items[index].witness_len);
      pwVar2 = stack->items;
      pwVar2[index].witness = new_witness;
      pwVar2[index].witness_len = witness_len;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int wally_tx_witness_stack_set(struct wally_tx_witness_stack *stack, size_t index,
                               const unsigned char *witness, size_t witness_len)
{
    unsigned char *new_witness = NULL;

    if (!is_valid_witness_stack(stack) || (!witness && witness_len))
        return WALLY_EINVAL;

    if (!clone_bytes(&new_witness, witness, witness_len))
        return WALLY_ENOMEM;

    if (index >= stack->num_items) {
        if (index >= stack->items_allocation_len) {
            /* Expand the witness array */
            struct wally_tx_witness_item *p;
            p = realloc_array(stack->items, stack->items_allocation_len,
                              index + 1, sizeof(*stack->items));
            if (!p) {
                clear_and_free(new_witness, witness_len);
                return WALLY_ENOMEM;
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
            stack->items = p;
            stack->items_allocation_len = index + 1;
        }
        stack->num_items = index + 1;
    }
    clear_and_free(stack->items[index].witness, stack->items[index].witness_len);
    stack->items[index].witness = new_witness;
    stack->items[index].witness_len = witness_len;
    return WALLY_OK;
}